

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::generateLoadQuery(SqlGenerator *this)

{
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TDNode *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t viewID;
  string drop_views;
  ofstream ofs;
  Attribute *att;
  size_t var;
  string *relName;
  TDNode *rel;
  size_t relID;
  string drop;
  string load;
  size_t in_stack_fffffffffffff9e8;
  TreeDecomposition *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  TreeDecomposition *in_stack_fffffffffffffa00;
  allocator *paVar2;
  Attribute *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  byte in_stack_fffffffffffffa1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  SqlGenerator *this_01;
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  ostream local_480 [512];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  Attribute *local_120;
  reference local_118;
  ulong local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  TDNode *local_80;
  TDNode *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this_01 = (SqlGenerator *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"",(allocator *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __lhs_00 = local_70;
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x30f157);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TreeDecomposition::numberOfRelations(this_00);
    if (pbVar1 <= __lhs_00) break;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x30f187);
    __rhs = TreeDecomposition::getRelation(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_80 = __rhs;
    local_78 = __rhs;
    std::operator+((char *)this_01,pbVar1);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::__cxx11::string::operator+=((string *)(local_61 + 1),local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::operator+((char *)this_01,pbVar1);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::__cxx11::string::operator+=(local_28,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    for (local_108 = 0; local_108 < 100; local_108 = local_108 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffffa1f =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff9f0);
      std::bitset<100UL>::reference::~reference(&local_118);
      if ((in_stack_fffffffffffffa1f & 1) != 0) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30f30c);
        in_stack_fffffffffffffa10 =
             TreeDecomposition::getAttribute
                       (in_stack_fffffffffffffa00,(size_t)in_stack_fffffffffffff9f8);
        local_120 = in_stack_fffffffffffffa10;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                       (char *)in_stack_fffffffffffffa10);
        typeToStr_abi_cxx11_(this_01,(Type)((ulong)pbVar1 >> 0x20));
        std::operator+(__lhs_00,&__rhs->_name);
        std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
        std::__cxx11::string::operator+=(local_28,local_140);
        std::__cxx11::string::~string(local_140);
        std::__cxx11::string::~string(local_160);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string(local_180);
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::operator+=(local_28,");\n");
    std::operator+((char *)this_01,pbVar1);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::operator+(in_stack_fffffffffffff9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9f0);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::operator+(in_stack_fffffffffffff9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9f0);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
    std::__cxx11::string::operator+=(local_28,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_280);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_70->field_0x1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (char *)in_stack_fffffffffffffa10);
  std::ofstream::ofstream(local_480,local_4a0,_S_out);
  std::__cxx11::string::~string(local_4a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
  std::operator<<(local_480,local_4c0);
  std::__cxx11::string::~string(local_4c0);
  std::ofstream::close();
  paVar2 = &local_4e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar1 = local_4f0;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x30f91c);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x30f924);
    if (__lhs <= pbVar1) break;
    std::__cxx11::to_string((unsigned_long)__lhs_00);
    std::operator+((char *)__lhs,pbVar1);
    std::operator+(__lhs,(char *)pbVar1);
    std::__cxx11::string::operator+=(local_4e0,local_510);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_550);
    local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_4f0->field_0x1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (char *)in_stack_fffffffffffffa10);
  std::ofstream::open((string *)local_480,(_Ios_Openmode)local_570);
  std::__cxx11::string::~string(local_570);
  std::operator<<(local_480,local_4e0);
  std::ofstream::close();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (char *)in_stack_fffffffffffffa10);
  std::ofstream::open((string *)local_480,(_Ios_Openmode)local_590);
  std::__cxx11::string::~string(local_590);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
  std::operator<<(local_480,local_5b0);
  std::__cxx11::string::~string(local_5b0);
  std::ofstream::close();
  std::__cxx11::string::~string(local_4e0);
  std::ofstream::~ofstream(local_480);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SqlGenerator::generateLoadQuery()
{
    string load = "", drop = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;

        drop += "DROP TABLE IF EXISTS "+relName+";\n";
        
        load += "CREATE TABLE "+relName+ "(";
        for (size_t var = 0; var < NUM_OF_VARIABLES; var++)
        {
            if (rel->_bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                load += att->_name+" "+typeToStr(att->_type)+",";
            }
        }
        load.pop_back();
        load += ");\n";

        load += "\\COPY "+relName+" FROM \'"+multifaq::dir::PATH_TO_DATA+"/"+relName+".tbl\' "+
                "DELIMITER \'|\' CSV;\n";
    }

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/load_data.sql", std::ofstream::out);
    ofs << drop + load;
    ofs.close();
    // DINFO(drop + load);

    string drop_views = "";

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
        drop_views +=  "DROP TABLE IF EXISTS view_"+std::to_string(viewID)+";\n";

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/lmfao_cleanup.sql", std::ofstream::out);
    ofs << drop_views;
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/drop_data.sql", std::ofstream::out);
    ofs << drop + drop_views;
    ofs.close();
}